

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_BanDatabase.cpp
# Opt level: O3

void __thiscall
RenX::BanDatabase::add
          (BanDatabase *this,string *name,uint32_t ip,uint8_t prefix_length,uint64_t steamid,
          string *hwid,string *rdns,string *banner,string *reason,seconds length,uint16_t flags)

{
  tuple<RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_> __s;
  undefined8 uVar1;
  undefined3 in_register_00000009;
  undefined4 uVar2;
  undefined4 in_register_0000000c;
  void *__buf;
  __uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_> local_60
  ;
  uint32_t local_58;
  undefined4 local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  uint64_t local_48;
  string *local_40;
  string *local_38;
  
  uVar2 = CONCAT31(in_register_00000009,prefix_length);
  local_58 = ip;
  local_54 = uVar2;
  local_48 = steamid;
  local_40 = hwid;
  local_38 = name;
  __s.
  super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
  .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
       )operator_new(0x110);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)__s.
                    super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                    .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x38);
  memset((void *)__s.
                 super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                 .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl,0,0x100);
  *(long *)((long)__s.
                  super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                  .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x38) =
       (long)__s.
             super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
             .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x48;
  *(long *)((long)__s.
                  super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                  .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x58) =
       (long)__s.
             super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
             .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x68;
  *(long *)((long)__s.
                  super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                  .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x78) =
       (long)__s.
             super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
             .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x88;
  *(long *)((long)__s.
                  super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                  .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x98) =
       (long)__s.
             super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
             .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0xa8;
  *(long *)((long)__s.
                  super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                  .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0xb8) =
       (long)__s.
             super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
             .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 200;
  *(long *)((long)__s.
                  super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                  .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0xd8) =
       (long)__s.
             super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
             .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x108;
  *(undefined8 *)
   ((long)__s.
          super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
          .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0xe0) = 1;
  *(undefined8 *)
   ((long)__s.
          super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
          .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0xe8) = 0;
  *(undefined8 *)
   ((long)__s.
          super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
          .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0xf0) = 0;
  *(undefined4 *)
   ((long)__s.
          super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
          .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0xf8) =
       0x3f800000;
  *(undefined8 *)
   ((long)__s.
          super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
          .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x100) = 0;
  *(undefined8 *)
   ((long)__s.
          super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
          .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x108) = 0;
  *(uint16_t *)
   ((long)__s.
          super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
          .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x10) =
       flags | 0x8000;
  local_60._M_t.
  super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
  .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl =
       (tuple<RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>)
       (tuple<RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>)
       __s.
       super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
       .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl;
  uVar1 = std::chrono::_V2::system_clock::now();
  *(undefined8 *)
   ((long)__s.
          super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
          .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x18) = uVar1;
  *(rep *)((long)__s.
                 super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                 .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x20) =
       length.__r;
  *(uint64_t *)
   ((long)__s.
          super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
          .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x28) = local_48;
  *(uint32_t *)
   ((long)__s.
          super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
          .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x30) = local_58;
  *(char *)((long)__s.
                  super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                  .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x34) =
       (char)local_54;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_50,local_40);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)__s.
                    super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                    .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x58),
             rdns);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)__s.
                    super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                    .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x78),
             local_38);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)__s.
                    super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                    .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x98),
             banner);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)__s.
                    super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                    .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0xb8),
             reason);
  std::
  vector<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>,std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>>>
  ::
  emplace_back<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>>
            ((vector<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>,std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>>>
              *)&this->m_entries,
             (unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_> *
             )&local_60);
  write(this,(int)(this->m_entries).
                  super__Vector_base<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                  super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                  .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl,__buf,
        CONCAT44(in_register_0000000c,uVar2));
  std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>::
  ~unique_ptr((unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
               *)&local_60);
  return;
}

Assistant:

void RenX::BanDatabase::add(std::string name, uint32_t ip, uint8_t prefix_length, uint64_t steamid, std::string hwid, std::string rdns, std::string banner, std::string reason, std::chrono::seconds length, uint16_t flags) {
	std::unique_ptr<Entry> entry = std::make_unique<Entry>();
	entry->set_active();
	entry->flags |= flags;
	entry->timestamp = std::chrono::system_clock::now();
	entry->length = length;
	entry->steamid = steamid;
	entry->ip = ip;
	entry->prefix_length = prefix_length;
	entry->hwid = std::move(hwid);
	entry->rdns = std::move(rdns);
	entry->name = std::move(name);
	entry->banner = std::move(banner);
	entry->reason = std::move(reason);

	m_entries.push_back(std::move(entry));
	write(m_entries.back().get());
}